

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O2

int upsample(double *x,int lenx,int M,double *y)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  
  if (M < 0) {
    lenx = -1;
  }
  else if (M == 0) {
    uVar2 = 0;
    uVar3 = 0;
    if (0 < lenx) {
      uVar3 = (ulong)(uint)lenx;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      y[uVar2] = x[uVar2];
    }
  }
  else {
    iVar1 = (lenx + -1) * M;
    iVar6 = 1;
    iVar5 = 0;
    for (lVar4 = 0; lVar4 <= iVar1; lVar4 = lVar4 + 1) {
      y[lVar4] = 0.0;
      iVar6 = iVar6 + -1;
      if (iVar6 == 0) {
        y[lVar4] = x[iVar5];
        iVar5 = iVar5 + 1;
        iVar6 = M;
      }
    }
    lenx = iVar1 + 1;
  }
  return lenx;
}

Assistant:

int upsample(double *x,int lenx, int M, double *y) {
	int N,i,j,k;

	if (M < 0) {
		return -1;
	}

	if (M == 0) {
		for (i = 0; i < lenx; ++i) {
			y[i] = x[i];
		}
		return lenx;
	}

	N = M * (lenx-1) + 1;
	j = 1;
	k = 0;

	for(i = 0; i < N;++i) {
		j--;
		y[i] = 0.0;
		if (j == 0) {
			y[i] = x[k];
			k++;
			j = M;
		}
	}

	return N;
}